

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gfxwrapper_opengl.c
# Opt level: O0

ksGpuSurfaceBits
ksGpuContext_BitsForSurfaceFormat
          (ksGpuSurfaceColorFormat colorFormat,ksGpuSurfaceDepthFormat depthFormat)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  undefined1 uVar5;
  ksGpuSurfaceBits kVar6;
  ksGpuSurfaceDepthFormat depthFormat_local;
  ksGpuSurfaceColorFormat colorFormat_local;
  ksGpuSurfaceBits bits;
  
  if (colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R8G8B8A8) {
    cVar1 = '\b';
  }
  else if (colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_B8G8R8A8) {
    cVar1 = '\b';
  }
  else if (colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R5G6B5) {
    cVar1 = '\x05';
  }
  else {
    cVar1 = '\b';
    if (colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_B5G6R5) {
      cVar1 = '\x05';
    }
  }
  if (colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R8G8B8A8) {
    cVar2 = '\b';
  }
  else if (colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_B8G8R8A8) {
    cVar2 = '\b';
  }
  else if (colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R5G6B5) {
    cVar2 = '\x06';
  }
  else {
    cVar2 = '\b';
    if (colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_B5G6R5) {
      cVar2 = '\x06';
    }
  }
  if (colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R8G8B8A8) {
    cVar3 = '\b';
  }
  else if (colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_B8G8R8A8) {
    cVar3 = '\b';
  }
  else if (colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R5G6B5) {
    cVar3 = '\x05';
  }
  else {
    cVar3 = '\b';
    if (colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_B5G6R5) {
      cVar3 = '\x05';
    }
  }
  if (colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R8G8B8A8) {
    cVar4 = '\b';
  }
  else if (colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_B8G8R8A8) {
    cVar4 = '\b';
  }
  else if (colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R5G6B5) {
    cVar4 = '\0';
  }
  else {
    cVar4 = '\b';
    if (colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_B5G6R5) {
      cVar4 = '\0';
    }
  }
  if (depthFormat == KS_GPU_SURFACE_DEPTH_FORMAT_D16) {
    uVar5 = 0x10;
  }
  else {
    uVar5 = 0;
    if (depthFormat == KS_GPU_SURFACE_DEPTH_FORMAT_D24) {
      uVar5 = 0x18;
    }
  }
  kVar6.colorBits = cVar1 + cVar2 + cVar3 + cVar4;
  kVar6.depthBits = uVar5;
  kVar6.redBits = cVar1;
  kVar6.greenBits = cVar2;
  kVar6.blueBits = cVar3;
  kVar6.alphaBits = cVar4;
  return kVar6;
}

Assistant:

ksGpuSurfaceBits ksGpuContext_BitsForSurfaceFormat(const ksGpuSurfaceColorFormat colorFormat,
                                                   const ksGpuSurfaceDepthFormat depthFormat) {
    ksGpuSurfaceBits bits;
    bits.redBits = ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R8G8B8A8)
                        ? 8
                        : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_B8G8R8A8)
                               ? 8
                               : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R5G6B5)
                                      ? 5
                                      : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_B5G6R5) ? 5 : 8))));
    bits.greenBits = ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R8G8B8A8)
                          ? 8
                          : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_B8G8R8A8)
                                 ? 8
                                 : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R5G6B5)
                                        ? 6
                                        : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_B5G6R5) ? 6 : 8))));
    bits.blueBits = ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R8G8B8A8)
                         ? 8
                         : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_B8G8R8A8)
                                ? 8
                                : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R5G6B5)
                                       ? 5
                                       : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_B5G6R5) ? 5 : 8))));
    bits.alphaBits = ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R8G8B8A8)
                          ? 8
                          : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_B8G8R8A8)
                                 ? 8
                                 : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R5G6B5)
                                        ? 0
                                        : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_B5G6R5) ? 0 : 8))));
    bits.colorBits = bits.redBits + bits.greenBits + bits.blueBits + bits.alphaBits;
    bits.depthBits =
        ((depthFormat == KS_GPU_SURFACE_DEPTH_FORMAT_D16) ? 16 : ((depthFormat == KS_GPU_SURFACE_DEPTH_FORMAT_D24) ? 24 : 0));
    return bits;
}